

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFImporter.cpp
# Opt level: O2

void __thiscall Assimp::glTFImporter::ImportMeshes(glTFImporter *this,Asset *r)

{
  uint *puVar1;
  int a;
  pointer ppMVar2;
  Mesh *pMVar3;
  size_t sVar4;
  long *plVar5;
  Accessor *acc;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint c;
  aiMesh *paVar10;
  float *pfVar11;
  ulong *puVar12;
  aiFace *paVar13;
  DeadlyImportError *pDVar14;
  uint i_2;
  pointer pPVar15;
  ulong uVar16;
  size_t tc;
  ulong uVar17;
  uint number;
  list<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_> *plVar18;
  ulong uVar19;
  long lVar20;
  uint *puVar21;
  long lVar22;
  uint i;
  Ref<glTF::Buffer> RVar23;
  aiFace *local_100;
  ulong local_f0;
  uint k;
  ulong local_e0;
  aiMesh *aim;
  Indexer data;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  string local_50;
  
  meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  k = 0;
  uVar19 = 0;
  do {
    ppMVar2 = (r->meshes).mObjs.super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (((ulong)((long)(r->meshes).mObjs.
                       super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)ppMVar2) >> 3 & 0xffffffff) <=
        uVar19) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->meshOffsets,&k);
      BaseImporter::CopyVector<aiMesh*>(&meshes,&this->mScene->mMeshes,&this->mScene->mNumMeshes);
      std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base
                (&meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>);
      return;
    }
    pMVar3 = ppMVar2[uVar19];
    local_e0 = uVar19;
    if (*(size_t *)
         ((long)&(pMVar3->Extension).
                 super__List_base<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>
                 ._M_impl + 0x10) != 0) {
      plVar18 = &pMVar3->Extension;
      while (plVar18 = *(list<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>
                         **)&(plVar18->
                             super__List_base<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>
                             )._M_impl._M_node, plVar18 != &pMVar3->Extension) {
        sVar4 = *(size_t *)
                 ((long)&(plVar18->
                         super__List_base<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>
                         )._M_impl._M_node + 0x10);
        if (*(int *)(sVar4 + 8) != 0) {
          pDVar14 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          to_string<glTF::Mesh::SExtension::EType>(&local_50,*(EType *)(sVar4 + 8));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&aim,
                         "GLTF: Can not import mesh: unknown mesh extension (code: \"",&local_50);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&aim,
                         "\"), only Open3DGC is supported.");
          DeadlyImportError::DeadlyImportError(pDVar14,(string *)&data);
          __cxa_throw(pDVar14,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        if (2 < (ulong)(((long)*(pointer *)
                                ((long)&(pMVar3->primitives).
                                        super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                        ._M_impl + 8) -
                        *(long *)&(pMVar3->primitives).
                                  super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                  ._M_impl.super__Vector_impl_data) / 0xd0)) {
          pDVar14 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&data,
                     "GLTF: When using Open3DGC compression then only one primitive per mesh are allowed."
                     ,(allocator<char> *)&aim);
          DeadlyImportError::DeadlyImportError(pDVar14,(string *)&data);
          __cxa_throw(pDVar14,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        RVar23 = glTF::LazyDict<glTF::Buffer>::Get(&r->buffers,(string *)(sVar4 + 0x10));
        glTF::Buffer::EncodedRegion_SetCurrent
                  (((RVar23.vector)->
                   super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[RVar23._8_8_ & 0xffffffff],
                   &(pMVar3->super_Object).id);
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->meshOffsets,&k);
    lVar20 = *(long *)&(pMVar3->primitives).
                       super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                       ._M_impl.super__Vector_impl_data;
    pPVar15 = *(pointer *)
               ((long)&(pMVar3->primitives).
                       super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                       ._M_impl + 8);
    k = k + (int)(((long)pPVar15 - lVar20) / 0xd0);
    uVar19 = local_e0;
    for (number = 0; (ulong)number < (ulong)(((long)pPVar15 - lVar20) / 0xd0); number = number + 1)
    {
      paVar10 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(paVar10);
      aim = paVar10;
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(&meshes,&aim);
      paVar10 = aim;
      uVar17 = (pMVar3->super_Object).id._M_string_length;
      if (uVar17 < 0x400) {
        (aim->mName).length = (ai_uint32)uVar17;
        memcpy((aim->mName).data,(pMVar3->super_Object).id._M_dataplus._M_p,uVar17);
        (paVar10->mName).data[uVar17] = '\0';
      }
      paVar10 = aim;
      if (1 < (ulong)(((long)*(pointer *)
                              ((long)&(pMVar3->primitives).
                                      super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                      ._M_impl + 8) -
                      *(long *)&(pMVar3->primitives).
                                super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                                ._M_impl.super__Vector_impl_data) / 0xd0)) {
        uVar6 = (aim->mName).length;
        (aim->mName).data[uVar6] = '-';
        uVar6 = ASSIMP_itoa10((aim->mName).data + (ulong)uVar6 + 1,0x3ff - uVar6,number);
        (paVar10->mName).length = uVar6 + (paVar10->mName).length + 1;
      }
      puVar21 = (uint *)(lVar20 + (ulong)number * 0xd0);
      if ((ulong)*puVar21 < 7) {
        aim->mPrimitiveTypes = aim->mPrimitiveTypes | *(uint *)(&DAT_0067c6bc + (ulong)*puVar21 * 4)
        ;
      }
      plVar5 = *(long **)(puVar21 + 2);
      if ((*(long **)(puVar21 + 4) != plVar5) && ((long *)*plVar5 != (long *)0x0)) {
        aim->mNumVertices =
             *(uint *)(*(long *)(*(long *)*plVar5 + (ulong)*(uint *)(plVar5 + 1) * 8) + 100);
        glTF::Accessor::ExtractData<aiVector3t<float>>
                  (*(Accessor **)
                    (*(long *)**(undefined8 **)(puVar21 + 2) +
                    (ulong)*(uint *)(*(undefined8 **)(puVar21 + 2) + 1) * 8),&aim->mVertices);
      }
      plVar5 = *(long **)(puVar21 + 8);
      if ((*(long **)(puVar21 + 10) != plVar5) && ((long *)*plVar5 != (long *)0x0)) {
        glTF::Accessor::ExtractData<aiVector3t<float>>
                  (*(Accessor **)(*(long *)*plVar5 + (ulong)*(uint *)(plVar5 + 1) * 8),
                   &aim->mNormals);
      }
      for (uVar17 = 0;
          (uVar17 < 8 &&
          (lVar20 = *(long *)(puVar21 + 0xe),
          uVar17 < (ulong)(*(long *)(puVar21 + 0x10) - lVar20 >> 4))); uVar17 = uVar17 + 1) {
        lVar22 = uVar17 * 0x10;
        glTF::Accessor::ExtractData<aiVector3t<float>>
                  (*(Accessor **)
                    (**(long **)(lVar20 + lVar22) + (ulong)*(uint *)(lVar20 + 8 + lVar22) * 8),
                   aim->mTextureCoords + uVar17);
        aim->mNumUVComponents[uVar17] =
             *(uint *)(&DAT_008de238 +
                      (ulong)*(uint *)(*(long *)(**(long **)(*(long *)(puVar21 + 0xe) + lVar22) +
                                                (ulong)*(uint *)(*(long *)(puVar21 + 0xe) + 8 +
                                                                lVar22) * 8) + 0x68) * 0x10);
        pfVar11 = &aim->mTextureCoords[uVar17]->y;
        for (uVar16 = 0; uVar16 < aim->mNumVertices; uVar16 = uVar16 + 1) {
          *pfVar11 = 1.0 - *pfVar11;
          pfVar11 = pfVar11 + 3;
        }
      }
      if (*(long **)(puVar21 + 0x2c) == (long *)0x0) {
        uVar6 = *puVar21;
        if (uVar6 < 7) {
          uVar7 = aim->mNumVertices;
          uVar17 = (ulong)uVar7;
          switch(uVar6) {
          case 0:
            puVar12 = (ulong *)operator_new__(uVar17 * 0x10 + 8);
            *puVar12 = uVar17;
            local_100 = (aiFace *)(puVar12 + 1);
            if (uVar17 != 0) {
              paVar13 = local_100;
              do {
                paVar13->mNumIndices = 0;
                paVar13->mIndices = (uint *)0x0;
                paVar13 = paVar13 + 1;
              } while (paVar13 != local_100 + uVar17);
            }
            paVar13 = local_100;
            for (uVar16 = 0; local_f0 = uVar17, uVar17 != uVar16; uVar16 = uVar16 + 1) {
              SetFace(paVar13,(int)uVar16);
              paVar13 = paVar13 + 1;
            }
            break;
          case 1:
            local_f0 = (ulong)(uVar7 >> 1);
            puVar12 = (ulong *)operator_new__(local_f0 * 0x10 + 8);
            *puVar12 = local_f0;
            local_100 = (aiFace *)(puVar12 + 1);
            if (1 < uVar7) {
              paVar13 = local_100;
              do {
                paVar13->mNumIndices = 0;
                paVar13->mIndices = (uint *)0x0;
                paVar13 = paVar13 + 1;
              } while (paVar13 != local_100 + local_f0);
            }
            for (uVar6 = 0; uVar6 < uVar7; uVar6 = uVar6 + 2) {
              SetFace(local_100 + (uVar6 >> 1),uVar6,uVar6 + 1);
            }
            break;
          default:
            uVar6 = uVar7 - (uVar6 == 3);
            local_f0 = (ulong)uVar6;
            puVar12 = (ulong *)operator_new__(local_f0 * 0x10 + 8);
            *puVar12 = local_f0;
            local_100 = (aiFace *)(puVar12 + 1);
            if (uVar6 != 0) {
              paVar13 = local_100;
              do {
                paVar13->mNumIndices = 0;
                paVar13->mIndices = (uint *)0x0;
                paVar13 = paVar13 + 1;
              } while (paVar13 != local_100 + local_f0);
            }
            SetFace(local_100,0,1);
            paVar13 = (aiFace *)(puVar12 + 3);
            for (uVar19 = 2; uVar19 < uVar17; uVar19 = uVar19 + 1) {
              SetFace(paVar13,paVar13[-1].mIndices[1],(int)uVar19);
              paVar13 = paVar13 + 1;
            }
            uVar19 = local_e0;
            if (*puVar21 == 2) {
              SetFace(local_100 + (uVar7 - 1),*(int *)(puVar12[(ulong)(uVar7 - 2) * 2 + 2] + 4),
                      *(int *)puVar12[2]);
              uVar19 = local_e0;
            }
            break;
          case 4:
            local_f0 = uVar17 / 3;
            puVar12 = (ulong *)operator_new__(local_f0 * 0x10 + 8);
            *puVar12 = local_f0;
            local_100 = (aiFace *)(puVar12 + 1);
            if (2 < uVar7) {
              paVar13 = local_100;
              do {
                paVar13->mNumIndices = 0;
                paVar13->mIndices = (uint *)0x0;
                paVar13 = paVar13 + 1;
              } while (paVar13 != local_100 + local_f0);
            }
            for (uVar6 = 0; uVar6 < uVar7; uVar6 = uVar6 + 3) {
              SetFace(local_100 + (ulong)uVar6 / 3,uVar6,uVar6 + 1,uVar6 + 2);
            }
            break;
          case 5:
            local_f0 = (ulong)(uVar7 - 2);
            puVar12 = (ulong *)operator_new__(local_f0 * 0x10 + 8);
            *puVar12 = local_f0;
            local_100 = (aiFace *)(puVar12 + 1);
            if (uVar7 - 2 != 0) {
              paVar13 = local_100;
              do {
                paVar13->mNumIndices = 0;
                paVar13->mIndices = (uint *)0x0;
                paVar13 = paVar13 + 1;
              } while (paVar13 != local_100 + local_f0);
            }
            SetFace(local_100,0,1,2);
            paVar13 = (aiFace *)(puVar12 + 3);
            for (uVar16 = 3; uVar16 < uVar17; uVar16 = uVar16 + 1) {
              SetFace(paVar13,paVar13[1].mIndices[1],paVar13[1].mIndices[2],(int)uVar16);
              paVar13 = paVar13 + 1;
            }
            break;
          case 6:
            local_f0 = (ulong)(uVar7 - 2);
            puVar12 = (ulong *)operator_new__(local_f0 * 0x10 + 8);
            *puVar12 = local_f0;
            local_100 = (aiFace *)(puVar12 + 1);
            if (uVar7 - 2 != 0) {
              paVar13 = local_100;
              do {
                paVar13->mNumIndices = 0;
                paVar13->mIndices = (uint *)0x0;
                paVar13 = paVar13 + 1;
              } while (paVar13 != local_100 + local_f0);
            }
            SetFace(local_100,0,1,2);
            paVar13 = (aiFace *)(puVar12 + 3);
            for (uVar16 = 3; uVar19 = local_e0, uVar16 < uVar17; uVar16 = uVar16 + 1) {
              SetFace(paVar13,*(int *)puVar12[2],paVar13[1].mIndices[2],(int)uVar16);
              paVar13 = paVar13 + 1;
            }
          }
          goto LAB_005500b3;
        }
      }
      else {
        acc = *(Accessor **)(**(long **)(puVar21 + 0x2c) + (ulong)puVar21[0x2e] * 8);
        uVar6 = acc->count;
        uVar17 = (ulong)uVar6;
        glTF::Accessor::Indexer::Indexer(&data,acc);
        if (data.data == (uint8_t *)0x0) {
          __assert_fail("data.IsValid()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/glTF/glTFImporter.cpp"
                        ,0x13f,"void Assimp::glTFImporter::ImportMeshes(glTF::Asset &)");
        }
        uVar19 = local_e0;
        switch(*puVar21) {
        case 0:
          puVar12 = (ulong *)operator_new__(uVar17 * 0x10 + 8);
          *puVar12 = uVar17;
          local_100 = (aiFace *)(puVar12 + 1);
          if (uVar17 != 0) {
            paVar13 = local_100;
            do {
              paVar13->mNumIndices = 0;
              paVar13->mIndices = (uint *)0x0;
              paVar13 = paVar13 + 1;
            } while (paVar13 != local_100 + uVar17);
          }
          paVar13 = local_100;
          for (uVar16 = 0; uVar19 = local_e0, local_f0 = uVar17, uVar17 != uVar16;
              uVar16 = uVar16 + 1) {
            uVar6 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,(int)uVar16);
            SetFace(paVar13,uVar6);
            paVar13 = paVar13 + 1;
          }
          break;
        case 1:
          local_f0 = (ulong)(uVar6 >> 1);
          puVar12 = (ulong *)operator_new__(local_f0 * 0x10 + 8);
          *puVar12 = local_f0;
          local_100 = (aiFace *)(puVar12 + 1);
          if (1 < uVar6) {
            paVar13 = local_100;
            do {
              paVar13->mNumIndices = 0;
              paVar13->mIndices = (uint *)0x0;
              paVar13 = paVar13 + 1;
            } while (paVar13 != local_100 + local_f0);
          }
          for (uVar7 = 0; uVar19 = local_e0, uVar7 < uVar6; uVar7 = uVar7 + 2) {
            uVar8 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,uVar7);
            uVar9 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,uVar7 + 1);
            SetFace(local_100 + (uVar7 >> 1),uVar8,uVar9);
          }
          break;
        case 2:
        case 3:
          uVar7 = uVar6 - (*puVar21 == 3);
          local_f0 = (ulong)uVar7;
          puVar12 = (ulong *)operator_new__(local_f0 * 0x10 + 8);
          *puVar12 = local_f0;
          local_100 = (aiFace *)(puVar12 + 1);
          if (uVar7 != 0) {
            paVar13 = local_100;
            do {
              paVar13->mNumIndices = 0;
              paVar13->mIndices = (uint *)0x0;
              paVar13 = paVar13 + 1;
            } while (paVar13 != local_100 + local_f0);
          }
          uVar7 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,0);
          uVar8 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,1);
          SetFace(local_100,uVar7,uVar8);
          paVar13 = (aiFace *)(puVar12 + 3);
          for (uVar19 = 2; uVar19 < uVar17; uVar19 = uVar19 + 1) {
            uVar7 = paVar13[-1].mIndices[1];
            uVar8 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,(int)uVar19);
            SetFace(paVar13,uVar7,uVar8);
            paVar13 = paVar13 + 1;
          }
          uVar19 = local_e0;
          if (*puVar21 == 2) {
            SetFace(local_100 + (uVar6 - 1),*(int *)(puVar12[(ulong)(uVar6 - 2) * 2 + 2] + 4),
                    *(int *)puVar12[2]);
            uVar19 = local_e0;
          }
          break;
        case 4:
          local_f0 = uVar17 / 3;
          puVar12 = (ulong *)operator_new__(local_f0 * 0x10 + 8);
          *puVar12 = local_f0;
          local_100 = (aiFace *)(puVar12 + 1);
          if (2 < uVar6) {
            paVar13 = local_100;
            do {
              paVar13->mNumIndices = 0;
              paVar13->mIndices = (uint *)0x0;
              paVar13 = paVar13 + 1;
            } while (paVar13 != local_100 + local_f0);
          }
          for (uVar7 = 0; uVar19 = local_e0, uVar7 < uVar6; uVar7 = uVar7 + 3) {
            uVar8 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,uVar7);
            uVar9 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,uVar7 + 1);
            c = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,uVar7 + 2);
            SetFace(local_100 + (ulong)uVar7 / 3,uVar8,uVar9,c);
          }
          break;
        case 5:
          local_f0 = (ulong)(uVar6 - 2);
          puVar12 = (ulong *)operator_new__(local_f0 * 0x10 + 8);
          *puVar12 = local_f0;
          local_100 = (aiFace *)(puVar12 + 1);
          if (uVar6 - 2 != 0) {
            paVar13 = local_100;
            do {
              paVar13->mNumIndices = 0;
              paVar13->mIndices = (uint *)0x0;
              paVar13 = paVar13 + 1;
            } while (paVar13 != local_100 + local_f0);
          }
          uVar6 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,0);
          uVar7 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,1);
          uVar8 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,2);
          SetFace(local_100,uVar6,uVar7,uVar8);
          paVar13 = (aiFace *)(puVar12 + 3);
          for (uVar16 = 3; uVar19 = local_e0, uVar16 < uVar17; uVar16 = uVar16 + 1) {
            uVar6 = paVar13[1].mIndices[1];
            uVar7 = paVar13[1].mIndices[2];
            uVar8 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,(int)uVar16);
            SetFace(paVar13,uVar6,uVar7,uVar8);
            paVar13 = paVar13 + 1;
          }
          break;
        case 6:
          local_f0 = (ulong)(uVar6 - 2);
          puVar12 = (ulong *)operator_new__(local_f0 * 0x10 + 8);
          *puVar12 = local_f0;
          local_100 = (aiFace *)(puVar12 + 1);
          if (uVar6 - 2 != 0) {
            paVar13 = local_100;
            do {
              paVar13->mNumIndices = 0;
              paVar13->mIndices = (uint *)0x0;
              paVar13 = paVar13 + 1;
            } while (paVar13 != local_100 + local_f0);
          }
          uVar6 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,0);
          uVar7 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,1);
          uVar8 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,2);
          SetFace(local_100,uVar6,uVar7,uVar8);
          paVar13 = (aiFace *)(puVar12 + 3);
          for (uVar16 = 3; uVar19 = local_e0, uVar16 < uVar17; uVar16 = uVar16 + 1) {
            a = *(int *)puVar12[2];
            uVar6 = paVar13[1].mIndices[2];
            uVar7 = glTF::Accessor::Indexer::GetValue<unsigned_int>(&data,(int)uVar16);
            SetFace(paVar13,a,uVar6,uVar7);
            paVar13 = paVar13 + 1;
          }
          break;
        default:
          goto switchD_0054f90f_default;
        }
LAB_005500b3:
        aim->mFaces = local_100;
        aim->mNumFaces = (uint)local_f0;
        for (uVar17 = 0; uVar17 != local_f0; uVar17 = uVar17 + 1) {
          uVar16 = 0;
          while (local_100[uVar17].mNumIndices != uVar16) {
            puVar1 = local_100[uVar17].mIndices + uVar16;
            uVar16 = uVar16 + 1;
            if (aim->mNumVertices <= *puVar1) {
              if (uVar17 < local_f0) {
                __assert_fail("CheckValidFacesIndices(faces, nFaces, aim->mNumVertices)",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/glTF/glTFImporter.cpp"
                              ,0x1c2,"void Assimp::glTFImporter::ImportMeshes(glTF::Asset &)");
              }
              goto switchD_0054f90f_default;
            }
          }
        }
      }
switchD_0054f90f_default:
      if (*(long *)(puVar21 + 0x30) != 0) {
        aim->mMaterialIndex = puVar21[0x32];
      }
      lVar20 = *(long *)&(pMVar3->primitives).
                         super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                         ._M_impl.super__Vector_impl_data;
      pPVar15 = *(pointer *)
                 ((long)&(pMVar3->primitives).
                         super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                         ._M_impl + 8);
    }
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

bool glTFImporter::CanRead(const std::string& pFile, IOSystem* pIOHandler, bool /* checkSig */) const {
    const std::string &extension = GetExtension(pFile);

    if (extension != "gltf" && extension != "glb") {
        return false;
    }

    if (pIOHandler) {
        glTF::Asset asset(pIOHandler);
        try {
            asset.Load(pFile, extension == "glb");
            std::string version = asset.asset.version;
            return !version.empty() && version[0] == '1';
        } catch (...) {
            return false;
        }
    }

    return false;
}